

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O0

void __thiscall
testing::internal::TestEventRepeater::OnTestIterationStart
          (TestEventRepeater *this,UnitTest *unit_test,int iteration)

{
  size_type sVar1;
  reference ppTVar2;
  uint in_EDX;
  undefined8 in_RSI;
  long in_RDI;
  size_t i;
  ulong local_20;
  
  if ((*(byte *)(in_RDI + 8) & 1) != 0) {
    for (local_20 = 0;
        sVar1 = std::
                vector<testing::TestEventListener_*,_std::allocator<testing::TestEventListener_*>_>
                ::size((vector<testing::TestEventListener_*,_std::allocator<testing::TestEventListener_*>_>
                        *)(in_RDI + 0x10)), local_20 < sVar1; local_20 = local_20 + 1) {
      ppTVar2 = std::
                vector<testing::TestEventListener_*,_std::allocator<testing::TestEventListener_*>_>
                ::operator[]((vector<testing::TestEventListener_*,_std::allocator<testing::TestEventListener_*>_>
                              *)(in_RDI + 0x10),local_20);
      (*(*ppTVar2)->_vptr_TestEventListener[3])(*ppTVar2,in_RSI,(ulong)in_EDX);
    }
  }
  return;
}

Assistant:

void TestEventRepeater::OnTestIterationStart(const UnitTest& unit_test,
                                             int iteration) {
  if (forwarding_enabled_) {
    for (size_t i = 0; i < listeners_.size(); i++) {
      listeners_[i]->OnTestIterationStart(unit_test, iteration);
    }
  }
}